

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

float ImGui::ScaleRatioFromValueT<int,int,float>
                (ImGuiDataType data_type,int v,int v_min,int v_max,bool is_logarithmic,
                float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar11 [16];
  undefined1 in_ZMM4 [64];
  float fVar12;
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  
  auVar9._4_60_ = in_register_00001204;
  auVar9._0_4_ = logarithmic_zero_epsilon;
  auVar7 = auVar9._0_16_;
  fVar5 = 0.0;
  iVar3 = v_max - v_min;
  if (iVar3 != 0) {
    iVar4 = v_max;
    if (iVar3 != 0 && v_min <= v_max) {
      iVar4 = v_min;
    }
    iVar2 = v_max;
    if (v_max < v_min) {
      iVar2 = v_min;
    }
    if (v < iVar2) {
      iVar2 = v;
    }
    if (v < iVar4) {
      iVar2 = iVar4;
    }
    auVar10._4_12_ = in_ZMM2._4_12_;
    if (is_logarithmic) {
      iVar3 = v_min;
      if (v_min < v_max) {
        iVar3 = v_max;
      }
      auVar10._0_4_ = (float)iVar3;
      iVar4 = v_min;
      if (v_max < v_min) {
        iVar4 = v_max;
      }
      auVar8._8_4_ = 0x7fffffff;
      auVar8._0_8_ = 0x7fffffff7fffffff;
      auVar8._12_4_ = 0x7fffffff;
      auVar1 = vandps_avx(auVar10,auVar8);
      auVar15._0_8_ =
           CONCAT44(in_register_00001204._0_4_,logarithmic_zero_epsilon) ^ 0x8000000080000000;
      auVar15._8_4_ = in_register_00001204._4_4_ ^ 0x80000000;
      auVar15._12_4_ = in_register_00001204._8_4_ ^ 0x80000000;
      auVar13 = auVar15;
      if (-1 < iVar3) {
        auVar13 = auVar7;
      }
      auVar11._0_4_ = (float)iVar4;
      auVar11._4_12_ = in_ZMM4._4_12_;
      auVar1 = vcmpss_avx(auVar1,auVar7,1);
      auVar1 = vblendvps_avx(auVar10,auVar13,auVar1);
      auVar13 = auVar15;
      fVar6 = auVar1._0_4_;
      if (-1 < iVar3 || iVar4 != 0) {
        auVar13 = vandps_avx(auVar11,auVar8);
        auVar8 = auVar15;
        if (-1 < iVar4) {
          auVar8 = auVar7;
        }
        auVar7 = vcmpss_avx(auVar13,auVar7,1);
        auVar13 = vblendvps_avx(auVar11,auVar8,auVar7);
        if (-1 < iVar4) {
          auVar15 = auVar1;
        }
        fVar6 = auVar15._0_4_;
        if (iVar3 != 0) {
          fVar6 = auVar1._0_4_;
        }
      }
      fVar12 = (float)iVar2;
      fVar5 = 0.0;
      fVar14 = auVar13._0_4_;
      if (fVar14 < fVar12) {
        if (fVar6 <= fVar12) {
          fVar5 = 1.0;
        }
        else if (v_max * v_min < 0) {
          fVar5 = -auVar11._0_4_ / (auVar10._0_4_ - auVar11._0_4_);
          if (v != 0) {
            if (v < 0) {
              fVar6 = logf(-fVar12 / logarithmic_zero_epsilon);
              fVar12 = logf(-fVar14 / logarithmic_zero_epsilon);
              fVar5 = (1.0 - fVar6 / fVar12) * (fVar5 - zero_deadzone_halfsize);
            }
            else {
              fVar12 = logf(fVar12 / logarithmic_zero_epsilon);
              fVar6 = logf(fVar6 / logarithmic_zero_epsilon);
              fVar5 = (fVar12 / fVar6) * (1.0 - (fVar5 + zero_deadzone_halfsize)) +
                      fVar5 + zero_deadzone_halfsize;
            }
          }
        }
        else if ((v_max | v_min) < 0) {
          fVar5 = logf(fVar12 / fVar6);
          fVar6 = logf(fVar14 / fVar6);
          fVar5 = 1.0 - fVar5 / fVar6;
        }
        else {
          fVar5 = logf(fVar12 / fVar14);
          fVar6 = logf(fVar6 / fVar14);
          fVar5 = fVar5 / fVar6;
        }
      }
      if (v_max < v_min) {
        fVar5 = 1.0 - fVar5;
      }
    }
    else {
      fVar5 = (float)(iVar2 - v_min) / (float)iVar3;
    }
  }
  return fVar5;
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;

        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }

    // Linear slider
    return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
}